

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O0

aom_codec_err_t
aom_codec_encode(aom_codec_ctx_t *ctx,aom_image_t *img,aom_codec_pts_t pts,unsigned_long duration,
                aom_enc_frame_flags_t flags)

{
  aom_codec_encode_fn_t_conflict p_Var1;
  uint uVar2;
  aom_codec_alg_priv_t_conflict *paVar3;
  ulong in_RCX;
  aom_codec_pts_t in_RDX;
  aom_image_t *in_RSI;
  aom_codec_ctx_t *in_RDI;
  aom_enc_frame_flags_t in_R8;
  unsigned_short x87_orig_mode;
  aom_codec_err_t res;
  aom_codec_err_t local_2c;
  
  if ((in_RDI == (aom_codec_ctx_t *)0x0) || ((in_RSI != (aom_image_t *)0x0 && (in_RCX == 0)))) {
    local_2c = AOM_CODEC_INVALID_PARAM;
  }
  else if ((in_RDI->iface == (aom_codec_iface_t *)0x0) || (in_RDI->priv == (aom_codec_priv_t *)0x0))
  {
    local_2c = AOM_CODEC_ERROR;
  }
  else if ((in_RDI->iface->caps & 2U) == 0) {
    local_2c = AOM_CODEC_INCAPABLE;
  }
  else if ((in_RSI == (aom_image_t *)0x0) ||
          (((in_RSI->fmt & 0x800) != AOM_IMG_FMT_NONE) == ((in_RDI->init_flags & 0x40000U) != 0))) {
    if (in_RCX < 0x100000000) {
      uVar2 = x87_set_double_precision();
      p_Var1 = (in_RDI->iface->enc).encode;
      paVar3 = (aom_codec_alg_priv_t_conflict *)get_alg_priv(in_RDI);
      local_2c = (*p_Var1)(paVar3,in_RSI,in_RDX,in_RCX,in_R8);
      x87_set_control_word((unsigned_short)uVar2);
    }
    else {
      local_2c = AOM_CODEC_INVALID_PARAM;
    }
  }
  else {
    local_2c = AOM_CODEC_INVALID_PARAM;
  }
  if (in_RDI != (aom_codec_ctx_t *)0x0) {
    in_RDI->err = local_2c;
  }
  return local_2c;
}

Assistant:

aom_codec_err_t aom_codec_encode(aom_codec_ctx_t *ctx, const aom_image_t *img,
                                 aom_codec_pts_t pts, unsigned long duration,
                                 aom_enc_frame_flags_t flags) {
  aom_codec_err_t res = AOM_CODEC_OK;

  if (!ctx || (img && !duration))
    res = AOM_CODEC_INVALID_PARAM;
  else if (!ctx->iface || !ctx->priv)
    res = AOM_CODEC_ERROR;
  else if (!(ctx->iface->caps & AOM_CODEC_CAP_ENCODER))
    res = AOM_CODEC_INCAPABLE;
  else if (img && ((img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) != 0) !=
                      ((ctx->init_flags & AOM_CODEC_USE_HIGHBITDEPTH) != 0)) {
    res = AOM_CODEC_INVALID_PARAM;
#if ULONG_MAX > UINT32_MAX
  } else if (duration > UINT32_MAX) {
    res = AOM_CODEC_INVALID_PARAM;
#endif
  } else {
    /* Execute in a normalized floating point environment, if the platform
     * requires it.
     */
    FLOATING_POINT_INIT
    res = ctx->iface->enc.encode(get_alg_priv(ctx), img, pts, duration, flags);
    FLOATING_POINT_RESTORE
  }

  return SAVE_STATUS(ctx, res);
}